

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

void __thiscall RPCResults::RPCResults(RPCResults *this,RPCResult result)

{
  RPCResult *in_RSI;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  allocator_type local_a1;
  RPCResult local_a0;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  RPCResult::RPCResult(&local_a0,in_RSI);
  __l._M_len = 1;
  __l._M_array = &local_a0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&this->m_results,__l,&local_a1);
  RPCResult::~RPCResult(&local_a0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RPCResults(RPCResult result)
        : m_results{{result}}
    {
    }